

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O3

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong __n;
  void *__dest;
  cf_hmac_ctx local_308;
  
  if (nout != 0) {
    uVar1 = ctx->reseed_counter;
    do {
      uVar2 = 0x10000;
      if (nout < 0x10000) {
        uVar2 = nout;
      }
      if (uVar1 == 0) {
        abort();
      }
      uVar3 = uVar2;
      __dest = out;
      if (naddnl != 0) {
        hmac_drbg_update(ctx,addnl,naddnl,(void *)0x0,0,(void *)0x0,0);
      }
      do {
        memcpy(&local_308,&ctx->hmac,0x2d8);
        cf_hmac_update(&local_308,ctx,((ctx->hmac).hash)->hashsz);
        cf_hmac_finish(&local_308,ctx->V);
        __n = ((ctx->hmac).hash)->hashsz;
        if (uVar3 <= __n) {
          __n = uVar3;
        }
        memcpy(__dest,ctx,__n);
        uVar3 = uVar3 - __n;
        __dest = (void *)((long)__dest + __n);
      } while (uVar3 != 0);
      hmac_drbg_update(ctx,addnl,naddnl,(void *)0x0,0,(void *)0x0,0);
      uVar1 = ctx->reseed_counter + 1;
      ctx->reseed_counter = uVar1;
      out = (void *)((long)out + uVar2);
      addnl = (void *)0x0;
      naddnl = 0;
      nout = nout - uVar2;
    } while (nout != 0);
  }
  return;
}

Assistant:

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,
                                 const void *addnl, size_t naddnl,
                                 void *out, size_t nout)
{
  uint8_t *bout = out;

  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hmac_drbg_generate(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}